

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetPchFile
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  long *plVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var7;
  string *psVar8;
  cmValue name;
  long lVar9;
  ulong *puVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar11;
  string pchExtension;
  string pchFileObject;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Base_ptr local_68;
  string *local_60;
  string *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  std::operator+(&local_88,language,config);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,(ulong)(arch->_M_dataplus)._M_p);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_c0._M_allocated_capacity = *puVar10;
    local_c0._8_8_ = plVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0._M_allocated_capacity = *puVar10;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
  }
  local_b0.first._M_string_length = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  paVar1 = &local_b0.first.field_2;
  if (local_d0 == &local_c0) {
    local_b0.first.field_2._8_8_ = local_c0._8_8_;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.first._M_dataplus._M_p = (pointer)local_d0;
  }
  local_b0.first.field_2._M_allocated_capacity = local_c0._M_allocated_capacity;
  local_c8 = 0;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffffffffff00;
  local_b0.second = "";
  local_d0 = &local_c0;
  local_60 = config;
  local_58 = language;
  pVar11 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->PchFiles,&local_b0);
  _Var7 = pVar11.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.first._M_dataplus._M_p,local_b0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar2 = this->Makefile;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CMAKE_PCH_EXTENSION","");
    psVar8 = cmMakefile::GetSafeDefinition(pcVar2,&local_b0.first);
    local_d0 = &local_c0;
    pcVar3 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar3,pcVar3 + psVar8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CMAKE_LINK_PCH","");
    bVar5 = cmMakefile::IsOn(pcVar2,&local_b0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    local_68 = _Var7._M_node + 2;
    if (bVar5) {
      local_b0.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"PRECOMPILE_HEADERS_REUSE_FROM","");
      name = GetProperty(this,&local_b0.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.first._M_dataplus._M_p,
                        local_b0.first.field_2._M_allocated_capacity + 1);
      }
      if (name.Value != (string *)0x0) {
        this = cmGlobalGenerator::FindGeneratorTarget
                         (this->LocalGenerator->GlobalGenerator,name.Value);
      }
      GetPchFileObject(&local_88,this,local_60,local_58,arch);
      if (local_c8 != 0) {
        lVar9 = std::__cxx11::string::rfind((char)&local_88,0x2e);
        local_48 = 0;
        local_40 = 0;
        local_50 = &local_40;
        if (lVar9 != -1) {
          std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_88);
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0.first._M_dataplus._M_p,
                            local_b0.first.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_d0);
        std::__cxx11::string::operator=((string *)local_68,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      GetPchHeader(&local_b0.first,this,local_60,local_58,arch);
      p_Var4 = local_68;
      std::__cxx11::string::operator=((string *)local_68,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.first._M_dataplus._M_p,
                        local_b0.first.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append((char *)p_Var4,(ulong)local_d0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(_Var7._M_node + 2),
             (long)&(_Var7._M_node[2]._M_parent)->_M_color + *(long *)(_Var7._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchFile(const std::string& config,
                                          const std::string& language,
                                          const std::string& arch)
{
  const auto inserted =
    this->PchFiles.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& pchFile = inserted.first->second;

    const std::string pchExtension =
      this->Makefile->GetSafeDefinition("CMAKE_PCH_EXTENSION");

    if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      auto replaceExtension = [](const std::string& str,
                                 const std::string& ext) -> std::string {
        auto dot_pos = str.rfind('.');
        std::string result;
        if (dot_pos != std::string::npos) {
          result = str.substr(0, dot_pos);
        }
        result += ext;
        return result;
      };

      cmGeneratorTarget* generatorTarget = this;
      cmValue pchReuseFrom =
        generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      if (pchReuseFrom) {
        generatorTarget =
          this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
      }

      const std::string pchFileObject =
        generatorTarget->GetPchFileObject(config, language, arch);
      if (!pchExtension.empty()) {
        pchFile = replaceExtension(pchFileObject, pchExtension);
      }
    } else {
      pchFile = this->GetPchHeader(config, language, arch);
      pchFile += pchExtension;
    }
  }
  return inserted.first->second;
}